

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerListOverwritesExisting<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentFromInitializerListOverwritesExisting<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  size_t sVar1;
  AssertHelperData *pAVar2;
  long lVar3;
  parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> local_a69;
  key_equal local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a60;
  AssertHelper local_a58;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_a50;
  undefined4 local_a38;
  pointer local_a30;
  pointer ppStack_a28;
  pointer local_a20;
  allocator_type local_a18;
  pair<const_phmap::priv::NonStandardLayout,_int> local_a10;
  pair<const_phmap::priv::NonStandardLayout,_int> local_9e0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_9b0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_980;
  pair<const_phmap::priv::NonStandardLayout,_int> local_950;
  undefined1 local_920 [16];
  pointer ppStack_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908 [66];
  size_t asStack_4e0 [8];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_4a0;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_a10,&local_a69);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_9e0,&local_a69);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_9b0,&local_a69);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_980,&local_a69);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_950,&local_a69);
  lVar3 = 0x40;
  do {
    pAVar2 = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
             next_id<phmap::priv::StatefulTestingHash>()::gId;
    sVar1 = hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
            next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
    *(undefined8 *)((long)asStack_4e0 + lVar3 + 0x10) = 0;
    *(undefined8 *)((long)asStack_4e0 + lVar3 + 0x18) = 0;
    *(undefined8 *)((long)asStack_4e0 + lVar3) = 0;
    *(undefined8 *)((long)asStack_4e0 + lVar3 + 8) = 0;
    *(undefined8 *)((long)asStack_4e0 + lVar3 + 0x28) = 0;
    *(size_t *)((long)asStack_4e0 + lVar3 + 0x30) = sVar1;
    local_a68.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
         (WithId<phmap::priv::StatefulTestingEqual>)(sVar1 + 1);
    *(AssertHelperData **)((long)asStack_4e0 + lVar3 + 0x38) = pAVar2;
    local_a58.data_ = (AssertHelperData *)((long)&pAVar2->type + 1);
    *(undefined8 *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
         (size_t)local_a68.super_WithId<phmap::priv::StatefulTestingEqual>.id_;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId = local_a58.data_;
  } while (lVar3 != 0x4c0);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId = (AssertHelperData *)((long)&pAVar2->type + 2);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ = sVar1 + 2;
  local_a18.id_ = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::NonStandardLayout_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)local_920,&local_a10,(pair<const_phmap::priv::NonStandardLayout,_int> *)local_920,0,
             (hasher *)&local_a58,&local_a68,&local_a18);
  lVar3 = 0;
  do {
    raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
    ::move_assign((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                   *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar3),local_920 + lVar3);
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x480);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              *)local_920);
  local_a38 = 3;
  std::
  vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::vector<std::pair<phmap::priv::NonStandardLayout_const,int>const*,void>
            ((vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_a30,&local_a10,(pair<const_phmap::priv::NonStandardLayout,_int> *)local_920,
             (allocator_type *)local_920);
  local_a50.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a20;
  local_a50.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppStack_a28;
  local_a50.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_a30;
  local_920._0_4_ = local_a38;
  local_a20 = (pointer)0x0;
  local_a30 = (pointer)0x0;
  ppStack_a28 = (pointer)0x0;
  local_a58.data_._0_4_ = local_a38;
  local_920._8_8_ = (pointer)0x0;
  ppStack_910 = (pointer)0x0;
  local_908[0]._M_allocated_capacity = 0;
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)(local_920 + 8));
  items<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>>
            ((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
              *)local_920,(priv *)&local_4a0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::operator()(&local_a68,(char *)&local_a58,
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
             *)local_920);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_a50);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)&local_a30);
  if ((char)local_a68.super_WithId<phmap::priv::StatefulTestingEqual>.id_ == '\0') {
    testing::Message::Message((Message *)local_920);
    if (local_a60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_a60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1d2,message);
    testing::internal::AssertHelper::operator=(&local_a58,(Message *)local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_a58);
    if ((long *)CONCAT44(local_920._4_4_,local_920._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_920._4_4_,local_920._0_4_) + 8))();
    }
  }
  if (local_a60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a60,local_a60);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_4a0);
  lVar3 = -0xf0;
  paVar4 = &local_950.first.value.field_2;
  do {
    (&paVar4->_M_allocated_capacity)[-3] = (size_type)&PTR__NonStandardLayout_00337320;
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -6);
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerListOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}